

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vw_exception.h
# Opt level: O2

void __thiscall
VW::vw_unrecognised_option_exception::vw_unrecognised_option_exception
          (vw_unrecognised_option_exception *this,char *file,int lineNumber,string *message)

{
  string local_40;
  
  std::__cxx11::string::string((string *)&local_40,(string *)message);
  vw_exception::vw_exception(&this->super_vw_exception,file,lineNumber,&local_40);
  std::__cxx11::string::~string((string *)&local_40);
  *(undefined ***)&this->super_vw_exception = &PTR__vw_exception_002a6238;
  return;
}

Assistant:

vw_unrecognised_option_exception(const char* file, int lineNumber, std::string message)
      : vw_exception(file, lineNumber, message)
  {
  }